

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall
flatbuffers::Parser::DoParse
          (Parser *this,char *source,char **include_paths,char *source_filename,
          char *include_filename)

{
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
  *this_00;
  char **ppcVar4;
  _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
  *this_01;
  mapped_type *pmVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *path;
  EnumDef **dest;
  int t;
  string *this_02;
  char **paths;
  string *psVar6;
  char **ppcVar7;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  string *local_120;
  string name;
  string contents;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string filepath;
  key_type local_80;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_78;
  string local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
  *local_48;
  _Base_ptr local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_80 = 0;
  local_120 = (string *)include_filename;
  if (include_filename != (char *)0x0) {
    bVar1 = FileExists(include_filename);
    ppcVar4 = (char **)0x0;
    if (bVar1) {
      ppcVar4 = include_paths;
    }
    local_80 = anon_unknown_0::HashFile(include_filename,(char *)ppcVar4);
    iVar2 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(source + 0x340),&local_80);
    if (iVar2._M_node != (_Base_ptr)(source + 0x348)) goto LAB_0011557c;
    pmVar3 = std::
             map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(source + 0x340),&local_80);
    std::__cxx11::string::assign((char *)pmVar3);
    contents.field_2._8_8_ = &contents._M_string_length;
    contents._M_dataplus._M_p = (pointer)0x0;
    contents._M_string_length = 0;
    contents.field_2._M_allocated_capacity = 0;
    local_d0 = 0;
    local_d8._M_p = (pointer)contents.field_2._8_8_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,include_filename,(allocator<char> *)&filepath);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                             *)(source + 0x370),&name)->_M_t;
    std::
    _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::operator=(this_00,(_Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
                         *)&contents);
    std::__cxx11::string::~string((string *)&name);
    std::
    _Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
    ::~_Rb_tree((_Rb_tree<flatbuffers::IncludedFile,_flatbuffers::IncludedFile,_std::_Identity<flatbuffers::IncludedFile>,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>
                 *)&contents);
  }
  psVar6 = local_120;
  ppcVar4 = DoParse::current_directory;
  if (source_filename != (char *)0x0) {
    ppcVar4 = (char **)source_filename;
  }
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::clear((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
           *)(source + 0x730));
  FlatBufferBuilderImpl<false>::Clear((FlatBufferBuilderImpl<false> *)(source + 0x1c8));
  *(undefined8 *)(source + 0x198) = *(undefined8 *)(source + 0x1a0);
  StartParseFile(this,source,(char *)include_paths);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
  CheckedError::~CheckedError((CheckedError *)this);
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(source + 0x28);
  local_48 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
              *)(source + 0x370);
  local_78 = (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(source + 0x340);
  local_40 = (_Base_ptr)(source + 0x348);
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(source + 0x3a0);
LAB_001156f2:
  while ((source[0x3f9] == '\x01' &&
         (((bVar1 = std::operator==(local_128,"option"), bVar1 ||
           (bVar1 = std::operator==(local_128,"syntax"), bVar1)) ||
          (bVar1 = std::operator==(local_128,"package"), bVar1))))) {
    ParseProtoDecl(this);
LAB_001157c0:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
    CheckedError::~CheckedError((CheckedError *)this);
  }
  bVar1 = IsIdent((Parser *)source,"native_include");
  t = (int)source;
  if (bVar1) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(local_38,local_128);
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        CheckedError::~CheckedError((CheckedError *)this);
        Expect(this,t);
        goto LAB_001157c0;
      }
    }
    goto LAB_00116001;
  }
  bVar1 = IsIdent((Parser *)source,"include");
  if ((!bVar1) &&
     ((source[0x3f9] != '\x01' || (bVar1 = IsIdent((Parser *)source,"import"), !bVar1)))) {
    local_120 = (string *)(source + 0x300);
    goto LAB_00115b2a;
  }
  Next(this);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
  CheckedError::~CheckedError((CheckedError *)this);
  path = extraout_RDX;
  if ((source[0x3f9] == '\x01') &&
     (bVar1 = std::operator==(local_128,"public"), path = extraout_RDX_00, bVar1)) {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
    CheckedError::~CheckedError((CheckedError *)this);
    path = extraout_RDX_01;
  }
  PosixPath_abi_cxx11_(&name,*(flatbuffers **)(source + 0x28),path);
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115ff7;
  CheckedError::~CheckedError((CheckedError *)this);
  filepath._M_string_length = 0;
  filepath._M_dataplus._M_p = (pointer)&filepath.field_2;
  filepath.field_2._M_local_buf[0] = '\0';
  ppcVar7 = ppcVar4;
  if (psVar6 != (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,(char *)psVar6,&local_129);
    StripFileName(&contents,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    ConCatPathFileName(&local_68,&contents,&name);
    std::__cxx11::string::operator=((string *)&filepath,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&contents);
    if ((filepath._M_string_length == 0) || (bVar1 = FileExists(filepath._M_dataplus._M_p), !bVar1))
    goto LAB_00115955;
    if (filepath._M_string_length != 0) {
LAB_001159cb:
      contents._M_dataplus._M_p = (pointer)&contents.field_2;
      contents._M_string_length = 0;
      contents.field_2._M_allocated_capacity =
           contents.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_d8._M_p = (pointer)&local_c8;
      local_d0 = 0;
      local_c8._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&contents);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,(char *)psVar6,&local_129);
      this_01 = (_Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                   ::operator[](local_48,&local_68);
      std::
      _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
      ::_M_insert_unique<flatbuffers::IncludedFile_const&>(this_01,(IncludedFile *)&contents);
      std::__cxx11::string::~string((string *)&local_68);
      IncludedFile::~IncludedFile((IncludedFile *)&contents);
      goto LAB_00115a4d;
    }
LAB_00115eb6:
    std::operator+(&contents,"unable to locate include file: ",&name);
    Error(this,(string *)source);
    goto LAB_00115fe0;
  }
LAB_00115955:
  do {
    if (*ppcVar7 == (char *)0x0) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,*ppcVar7,&local_129);
    ConCatPathFileName(&contents,&local_68,&name);
    std::__cxx11::string::operator=((string *)&filepath,(string *)&contents);
    std::__cxx11::string::~string((string *)&contents);
    std::__cxx11::string::~string((string *)&local_68);
    bVar1 = FileExists(filepath._M_dataplus._M_p);
    ppcVar7 = ppcVar7 + 1;
  } while (!bVar1);
  if (filepath._M_string_length == 0) goto LAB_00115eb6;
  psVar6 = local_120;
  if (local_120 != (string *)0x0) goto LAB_001159cb;
LAB_00115a4d:
  contents._M_dataplus._M_p = (pointer)&contents.field_2;
  contents._M_string_length = 0;
  contents.field_2._M_allocated_capacity =
       contents.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar1 = LoadFile(filepath._M_dataplus._M_p,true,&contents);
  local_68._M_dataplus._M_p =
       (pointer)anon_unknown_0::HashFile(filepath._M_dataplus._M_p,contents._M_dataplus._M_p);
  iVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_78,(key_type *)&local_68);
  if (iVar2._M_node != local_40) {
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115fe0;
    CheckedError::~CheckedError((CheckedError *)this);
    std::__cxx11::string::~string((string *)&contents);
    std::__cxx11::string::~string((string *)&filepath);
    std::__cxx11::string::~string((string *)&name);
    psVar6 = local_120;
    goto LAB_001156f2;
  }
  if (bVar1) {
    DoParse(this,source,(char **)contents._M_dataplus._M_p,(char *)ppcVar4,filepath._M_dataplus._M_p
           );
    psVar6 = local_120;
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      CheckedError::~CheckedError((CheckedError *)this);
      if (source[0x3fb] == '\0') {
        MarkGenerated((Parser *)source);
      }
      source[0x2f8] = '\0';
      source[0x2f9] = '\0';
      source[0x2fa] = '\0';
      source[0x2fb] = '\0';
      source[0x2fc] = '\0';
      source[0x2fd] = '\0';
      source[0x2fe] = '\0';
      source[0x2ff] = '\0';
      source[0x308] = '\0';
      source[0x309] = '\0';
      source[0x30a] = '\0';
      source[0x30b] = '\0';
      source[0x30c] = '\0';
      source[0x30d] = '\0';
      source[0x30e] = '\0';
      source[0x30f] = '\0';
      **(undefined1 **)(source + 0x300) = 0;
      source[0x328] = '\0';
      source[0x329] = '\0';
      source[0x32a] = '\0';
      source[0x32b] = '\0';
      source[0x32c] = '\0';
      source[0x32d] = '\0';
      source[0x32e] = '\0';
      source[0x32f] = '\0';
      **(undefined1 **)(source + 800) = 0;
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(local_78,&local_80);
      DoParse(this,source,include_paths,(char *)ppcVar4,(char *)psVar6);
    }
  }
  else {
    std::operator+(&local_68,"unable to load include file: ",&name);
    Error(this,(string *)source);
    std::__cxx11::string::~string((string *)&local_68);
  }
LAB_00115fe0:
  std::__cxx11::string::~string((string *)&contents);
  std::__cxx11::string::~string((string *)&filepath);
LAB_00115ff7:
  this_02 = &name;
  goto LAB_00115ffc;
LAB_00115b2a:
  if (*(int *)(source + 0x1c) != 0x100) {
    if (source[0x3f9] == '\x01') {
      ParseProtoDecl(this);
LAB_00115bb5:
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    else {
      bVar1 = IsIdent((Parser *)source,"namespace");
      if (bVar1) {
        ParseNamespace(this);
        goto LAB_00115bb5;
      }
      if (*(int *)(source + 0x1c) == 0x7b) goto LAB_0011557c;
      bVar1 = IsIdent((Parser *)source,"enum");
      if (bVar1) {
        dest = (EnumDef **)0x0;
LAB_00115bab:
        ParseEnum(this,SUB81(source,0),dest,(char *)0x0);
        goto LAB_00115bb5;
      }
      bVar1 = IsIdent((Parser *)source,"union");
      if (bVar1) {
        dest = (EnumDef **)0x1;
        goto LAB_00115bab;
      }
      bVar1 = IsIdent((Parser *)source,"root_type");
      if (!bVar1) {
        bVar1 = IsIdent((Parser *)source,"file_identifier");
        if (bVar1) {
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::_M_assign(local_120);
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
          CheckedError::~CheckedError((CheckedError *)this);
          if (*(long *)(source + 0x308) != 4) {
            NumToString<unsigned_long>(&filepath,4);
            std::operator+(&name,"file_identifier must be exactly ",&filepath);
            std::operator+(&contents,&name," characters");
            Error(this,(string *)source);
            std::__cxx11::string::~string((string *)&contents);
            std::__cxx11::string::~string((string *)&name);
            this_02 = &filepath;
            goto LAB_00115ffc;
          }
        }
        else {
          bVar1 = IsIdent((Parser *)source,"file_extension");
          if (!bVar1) {
            bVar1 = IsIdent((Parser *)source,"include");
            if (!bVar1) {
              bVar1 = IsIdent((Parser *)source,"attribute");
              if (!bVar1) {
                bVar1 = IsIdent((Parser *)source,"rpc_service");
                if (bVar1) {
                  ParseService(this,source);
                }
                else {
                  ParseDecl(this,source);
                }
                goto LAB_00115bb5;
              }
              Next(this);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckedError::~CheckedError((CheckedError *)this);
                std::__cxx11::string::string((string *)&contents,(string *)local_128);
                if (*(int *)(source + 0x1c) == 0x104) {
                  Next(this);
                }
                else {
                  Expect(this,t);
                }
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckedError::~CheckedError((CheckedError *)this);
                  Expect(this,t);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    CheckedError::~CheckedError((CheckedError *)this);
                    pmVar5 = std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                                           *)(source + 0x3b8),&contents);
                    *pmVar5 = false;
                    goto LAB_00115cb7;
                  }
                }
                goto LAB_00116079;
              }
              goto LAB_00116001;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&contents,"includes must come before declarations",
                       (allocator<char> *)&name);
            Error(this,(string *)source);
            goto LAB_00116079;
          }
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
          CheckedError::~CheckedError((CheckedError *)this);
          std::__cxx11::string::_M_assign((string *)(source + 800));
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        Expect(this,t);
        goto LAB_00115bb5;
      }
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
      CheckedError::~CheckedError((CheckedError *)this);
      std::__cxx11::string::string((string *)&contents,(string *)local_128);
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116079;
      CheckedError::~CheckedError((CheckedError *)this);
      ParseNamespacing(this,(string *)source,&contents);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116079;
      CheckedError::~CheckedError((CheckedError *)this);
      if (*(long *)(source + 0x558) == 0) {
        bVar1 = SetRootType((Parser *)source,contents._M_dataplus._M_p);
        if (bVar1) {
          if (*(char *)(*(long *)(source + 0x2f8) + 0x110) != '\x01') goto LAB_00115c94;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,"root type must be a table",(allocator<char> *)&filepath);
          Error(this,(string *)source);
        }
        else {
          std::operator+(&name,"unknown root type: ",&contents);
          Error(this,(string *)source);
        }
        std::__cxx11::string::~string((string *)&name);
        goto LAB_00116079;
      }
LAB_00115c94:
      Expect(this,t);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116079;
      CheckedError::~CheckedError((CheckedError *)this);
LAB_00115cb7:
      std::__cxx11::string::~string((string *)&contents);
    }
    goto LAB_00115b2a;
  }
  Expect(this,t);
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00116001;
  CheckedError::~CheckedError((CheckedError *)this);
  if ((source[0x619] != '\x01') || (source[0x6f9] != '\x01')) {
LAB_0011557c:
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
    goto LAB_00116001;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&contents,"treating warnings as errors, failed due to above warnings",
             (allocator<char> *)&name);
  Error(this,(string *)source);
LAB_00116079:
  this_02 = &contents;
LAB_00115ffc:
  std::__cxx11::string::~string((string *)this_02);
LAB_00116001:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParse(const char *source, const char **include_paths,
                             const char *source_filename,
                             const char *include_filename) {
  uint64_t source_hash = 0;
  if (source_filename) {
    // If the file is in-memory, don't include its contents in the hash as we
    // won't be able to load them later.
    if (FileExists(source_filename))
      source_hash = HashFile(source_filename, source);
    else
      source_hash = HashFile(source_filename, nullptr);

    if (included_files_.find(source_hash) == included_files_.end()) {
      included_files_[source_hash] = include_filename ? include_filename : "";
      files_included_per_file_[source_filename] = std::set<IncludedFile>();
    } else {
      return NoError();
    }
  }
  if (!include_paths) {
    static const char *current_directory[] = { "", nullptr };
    include_paths = current_directory;
  }
  field_stack_.clear();
  builder_.Clear();
  // Start with a blank namespace just in case this file doesn't have one.
  current_namespace_ = empty_namespace_;

  ECHECK(StartParseFile(source, source_filename));

  // Includes must come before type declarations:
  for (;;) {
    // Parse pre-include proto statements if any:
    if (opts.proto_mode && (attribute_ == "option" || attribute_ == "syntax" ||
                            attribute_ == "package")) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("native_include")) {
      NEXT();
      native_included_files_.emplace_back(attribute_);
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include") || (opts.proto_mode && IsIdent("import"))) {
      NEXT();
      if (opts.proto_mode && attribute_ == "public") NEXT();
      auto name = flatbuffers::PosixPath(attribute_.c_str());
      EXPECT(kTokenStringConstant);
      // Look for the file relative to the directory of the current file.
      std::string filepath;
      if (source_filename) {
        auto source_file_directory =
            flatbuffers::StripFileName(source_filename);
        filepath = flatbuffers::ConCatPathFileName(source_file_directory, name);
      }
      if (filepath.empty() || !FileExists(filepath.c_str())) {
        // Look for the file in include_paths.
        for (auto paths = include_paths; paths && *paths; paths++) {
          filepath = flatbuffers::ConCatPathFileName(*paths, name);
          if (FileExists(filepath.c_str())) break;
        }
      }
      if (filepath.empty())
        return Error("unable to locate include file: " + name);
      if (source_filename) {
        IncludedFile included_file;
        included_file.filename = filepath;
        included_file.schema_name = name;
        files_included_per_file_[source_filename].insert(included_file);
      }

      std::string contents;
      bool file_loaded = LoadFile(filepath.c_str(), true, &contents);
      if (included_files_.find(HashFile(filepath.c_str(), contents.c_str())) ==
          included_files_.end()) {
        // We found an include file that we have not parsed yet.
        // Parse it.
        if (!file_loaded) return Error("unable to load include file: " + name);
        ECHECK(DoParse(contents.c_str(), include_paths, filepath.c_str(),
                       name.c_str()));
        // We generally do not want to output code for any included files:
        if (!opts.generate_all) MarkGenerated();
        // Reset these just in case the included file had them, and the
        // parent doesn't.
        root_struct_def_ = nullptr;
        file_identifier_.clear();
        file_extension_.clear();
        // This is the easiest way to continue this file after an include:
        // instead of saving and restoring all the state, we simply start the
        // file anew. This will cause it to encounter the same include
        // statement again, but this time it will skip it, because it was
        // entered into included_files_.
        // This is recursive, but only go as deep as the number of include
        // statements.
        included_files_.erase(source_hash);
        return DoParse(source, include_paths, source_filename,
                       include_filename);
      }
      EXPECT(';');
    } else {
      break;
    }
  }
  // Now parse all other kinds of declarations:
  while (token_ != kTokenEof) {
    if (opts.proto_mode) {
      ECHECK(ParseProtoDecl());
    } else if (IsIdent("namespace")) {
      ECHECK(ParseNamespace());
    } else if (token_ == '{') {
      return NoError();
    } else if (IsIdent("enum")) {
      ECHECK(ParseEnum(false, nullptr, source_filename));
    } else if (IsIdent("union")) {
      ECHECK(ParseEnum(true, nullptr, source_filename));
    } else if (IsIdent("root_type")) {
      NEXT();
      auto root_type = attribute_;
      EXPECT(kTokenIdentifier);
      ECHECK(ParseNamespacing(&root_type, nullptr));
      if (opts.root_type.empty()) {
        if (!SetRootType(root_type.c_str()))
          return Error("unknown root type: " + root_type);
        if (root_struct_def_->fixed) return Error("root type must be a table");
      }
      EXPECT(';');
    } else if (IsIdent("file_identifier")) {
      NEXT();
      file_identifier_ = attribute_;
      EXPECT(kTokenStringConstant);
      if (file_identifier_.length() != flatbuffers::kFileIdentifierLength)
        return Error("file_identifier must be exactly " +
                     NumToString(flatbuffers::kFileIdentifierLength) +
                     " characters");
      EXPECT(';');
    } else if (IsIdent("file_extension")) {
      NEXT();
      file_extension_ = attribute_;
      EXPECT(kTokenStringConstant);
      EXPECT(';');
    } else if (IsIdent("include")) {
      return Error("includes must come before declarations");
    } else if (IsIdent("attribute")) {
      NEXT();
      auto name = attribute_;
      if (Is(kTokenIdentifier)) {
        NEXT();
      } else {
        EXPECT(kTokenStringConstant);
      }
      EXPECT(';');
      known_attributes_[name] = false;
    } else if (IsIdent("rpc_service")) {
      ECHECK(ParseService(source_filename));
    } else {
      ECHECK(ParseDecl(source_filename));
    }
  }
  EXPECT(kTokenEof);
  if (opts.warnings_as_errors && has_warning_) {
    return Error("treating warnings as errors, failed due to above warnings");
  }
  return NoError();
}